

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O2

ValueLength __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
findDataOffset(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,
              uint8_t head)

{
  uint uVar1;
  long lVar2;
  ValueLength VVar3;
  undefined3 in_register_00000031;
  
  uVar1 = SliceStaticData::FirstSubMap[CONCAT31(in_register_00000031,head)];
  lVar2 = *(long *)this;
  if (uVar1 == 0) {
    VVar3 = readVariableValueLength<false>((uint8_t *)(lVar2 + 1));
    VVar3 = getVariableValueLength(VVar3);
    return VVar3 + 1;
  }
  if (uVar1 < 3) {
    if (*(char *)(lVar2 + 2) != '\0') {
      return 2;
    }
  }
  else if (uVar1 != 3) {
    if (5 < uVar1) {
      return 9;
    }
    goto LAB_0010b437;
  }
  if (*(char *)(lVar2 + 3) != '\0') {
    return 3;
  }
LAB_0010b437:
  if (*(char *)(lVar2 + 5) == '\0') {
    return 9;
  }
  return 5;
}

Assistant:

ValueLength findDataOffset(uint8_t head) const noexcept {
    // Must be called for a non-empty array or object at start():
    VELOCYPACK_ASSERT(head != 0x01 && head != 0x0a && head <= 0x14);
    unsigned int fsm = SliceStaticData::FirstSubMap[head];
    uint8_t const* start = this->start();
    if (fsm == 0) {
      // need to calculate the offset by reading the dynamic length
      VELOCYPACK_ASSERT(head == 0x13 || head == 0x14);
      return 1 + arangodb::velocypack::getVariableValueLength(
                     readVariableValueLength<false>(start + 1));
    }
    if (fsm <= 2 && start[2] != 0) {
      return 2;
    }
    if (fsm <= 3 && start[3] != 0) {
      return 3;
    }
    if (fsm <= 5 && start[5] != 0) {
      return 5;
    }
    return 9;
  }